

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_avx2_256_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_table_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i *palVar1;
  long lVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  void *pvVar7;
  parasail_matrix_t *ppVar8;
  void *pvVar9;
  void *pvVar10;
  long lVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  short sVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  parasail_result_t *ppVar36;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *ptr;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  int16_t *ptr_06;
  long lVar37;
  long lVar38;
  short sVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  short sVar45;
  uint uVar46;
  uint uVar47;
  int iVar48;
  ulong uVar49;
  int iVar50;
  int16_t iVar51;
  short sVar52;
  int iVar53;
  long lVar54;
  long lVar55;
  undefined2 uVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  ulong uVar63;
  int iVar64;
  int iVar65;
  ulong uVar66;
  undefined2 uVar67;
  undefined2 uVar68;
  undefined2 uVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  __m256i_16_t h;
  undefined1 local_3a0 [32];
  long local_348;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_table_scan_profile_avx2_256_16_cold_8();
  }
  else {
    pvVar7 = (profile->profile16).score;
    if (pvVar7 == (void *)0x0) {
      parasail_nw_stats_table_scan_profile_avx2_256_16_cold_7();
    }
    else {
      ppVar8 = profile->matrix;
      if (ppVar8 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_table_scan_profile_avx2_256_16_cold_6();
      }
      else {
        uVar35 = profile->s1Len;
        if ((int)uVar35 < 1) {
          parasail_nw_stats_table_scan_profile_avx2_256_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_table_scan_profile_avx2_256_16_cold_4();
        }
        else {
          uVar63 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_stats_table_scan_profile_avx2_256_16_cold_3();
          }
          else if (open < 0) {
            parasail_nw_stats_table_scan_profile_avx2_256_16_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_stats_table_scan_profile_avx2_256_16_cold_1();
          }
          else {
            iVar64 = uVar35 - 1;
            uVar66 = (ulong)uVar35 + 0xf >> 4;
            iVar65 = (int)uVar66;
            uVar46 = iVar64 % iVar65;
            pvVar9 = (profile->profile16).matches;
            pvVar10 = (profile->profile16).similar;
            iVar50 = -open;
            iVar33 = ppVar8->min;
            iVar48 = -iVar33;
            if (iVar33 != iVar50 && SBORROW4(iVar33,iVar50) == iVar33 + open < 0) {
              iVar48 = open;
            }
            sVar32 = 0x7ffe - (short)ppVar8->max;
            ppVar36 = parasail_result_new_table3((uint)((ulong)uVar35 + 0xf) & 0x7ffffff0,s2Len);
            if (ppVar36 != (parasail_result_t *)0x0) {
              ppVar36->flag = ppVar36->flag | 0x10230401;
              b = parasail_memalign___m256i(0x20,uVar66);
              b_00 = parasail_memalign___m256i(0x20,uVar66);
              b_01 = parasail_memalign___m256i(0x20,uVar66);
              b_02 = parasail_memalign___m256i(0x20,uVar66);
              ptr = parasail_memalign___m256i(0x20,uVar66);
              b_03 = parasail_memalign___m256i(0x20,uVar66);
              b_04 = parasail_memalign___m256i(0x20,uVar66);
              b_05 = parasail_memalign___m256i(0x20,uVar66);
              ptr_00 = parasail_memalign___m256i(0x20,uVar66);
              ptr_01 = parasail_memalign___m256i(0x20,uVar66);
              ptr_02 = parasail_memalign___m256i(0x20,uVar66);
              ptr_03 = parasail_memalign___m256i(0x20,uVar66);
              ptr_04 = parasail_memalign___m256i(0x20,uVar66);
              ptr_05 = parasail_memalign___m256i(0x20,uVar66);
              ptr_06 = parasail_memalign_int16_t(0x20,(ulong)(s2Len + 1));
              if ((ptr_06 != (int16_t *)0x0 &&
                  (ptr_05 != (__m256i *)0x0 &&
                  (ptr_04 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0))) &&
                  ((ptr_02 != (__m256i *)0x0 &&
                   (ptr_01 != (__m256i *)0x0 && (ptr_00 != (__m256i *)0x0 && b_05 != (__m256i *)0x0)
                   )) && ((b_04 != (__m256i *)0x0 &&
                          (b_03 != (__m256i *)0x0 && ptr != (__m256i *)0x0)) &&
                         ((b_02 != (__m256i *)0x0 && b_01 != (__m256i *)0x0) &&
                         (b_00 != (__m256i *)0x0 && b != (__m256i *)0x0))))) {
                iVar33 = s2Len + -1;
                iVar34 = 0xf - iVar64 / iVar65;
                uVar67 = (undefined2)open;
                uVar68 = (undefined2)gap;
                uVar69 = (undefined2)(iVar48 - 0x7fffU);
                auVar70._0_2_ = (undefined2)uVar66;
                auVar70._2_2_ = auVar70._0_2_;
                auVar70._4_2_ = auVar70._0_2_;
                auVar70._6_2_ = auVar70._0_2_;
                auVar70._8_2_ = auVar70._0_2_;
                auVar70._10_2_ = auVar70._0_2_;
                auVar70._12_2_ = auVar70._0_2_;
                auVar70._14_2_ = auVar70._0_2_;
                auVar70._16_2_ = auVar70._0_2_;
                auVar70._18_2_ = auVar70._0_2_;
                auVar70._20_2_ = auVar70._0_2_;
                auVar70._22_2_ = auVar70._0_2_;
                auVar70._24_2_ = auVar70._0_2_;
                auVar70._26_2_ = auVar70._0_2_;
                auVar70._28_2_ = auVar70._0_2_;
                auVar70._30_2_ = auVar70._0_2_;
                auVar25 = vperm2i128_avx2(auVar70,auVar70,0x28);
                auVar71._0_2_ = (undefined2)-(iVar65 * gap);
                auVar71._2_2_ = auVar71._0_2_;
                auVar71._4_2_ = auVar71._0_2_;
                auVar71._6_2_ = auVar71._0_2_;
                auVar71._8_2_ = auVar71._0_2_;
                auVar71._10_2_ = auVar71._0_2_;
                auVar71._12_2_ = auVar71._0_2_;
                auVar71._14_2_ = auVar71._0_2_;
                auVar71._16_2_ = auVar71._0_2_;
                auVar71._18_2_ = auVar71._0_2_;
                auVar71._20_2_ = auVar71._0_2_;
                auVar71._22_2_ = auVar71._0_2_;
                auVar71._24_2_ = auVar71._0_2_;
                auVar71._26_2_ = auVar71._0_2_;
                auVar71._28_2_ = auVar71._0_2_;
                auVar71._30_2_ = auVar71._0_2_;
                auVar71 = vpand_avx2(auVar71,_DAT_008d4840);
                auVar74 = ZEXT432(iVar48 - 0x7fffU & 0xffff);
                auVar71 = vpaddsw_avx2(auVar74,auVar71);
                alVar3[1] = (longlong)b_04;
                alVar3[0] = (longlong)b_01;
                alVar3[2] = (longlong)b_03;
                alVar3[3] = (longlong)b_02;
                parasail_memset___m256i(b_03,alVar3,uVar66);
                alVar4[1] = (longlong)b_04;
                alVar4[0] = (longlong)b_01;
                alVar4[2] = (longlong)b_03;
                alVar4[3] = (longlong)b_02;
                parasail_memset___m256i(b_04,alVar4,uVar66);
                alVar5[1] = (longlong)b_04;
                alVar5[0] = (longlong)b_01;
                alVar5[2] = (longlong)b_03;
                alVar5[3] = (longlong)b_02;
                parasail_memset___m256i(b_05,alVar5,uVar66);
                alVar6[1] = (longlong)b_04;
                alVar6[0] = (longlong)b_01;
                alVar6[2] = (longlong)b_03;
                alVar6[3] = (longlong)b_02;
                parasail_memset___m256i(b,alVar6,uVar66);
                c[1] = (longlong)b_04;
                c[0] = (longlong)b_01;
                c[2] = (longlong)b_03;
                c[3] = (longlong)b_02;
                parasail_memset___m256i(b_00,c,uVar66);
                c_00[1] = (longlong)b_04;
                c_00[0] = (longlong)b_01;
                c_00[2] = (longlong)b_03;
                c_00[3] = (longlong)b_02;
                parasail_memset___m256i(b_01,c_00,uVar66);
                c_01[1] = (longlong)b_04;
                c_01[0] = (longlong)b_01;
                c_01[2] = (longlong)b_03;
                c_01[3] = (longlong)b_02;
                parasail_memset___m256i(b_02,c_01,uVar66);
                auVar17._2_2_ = uVar68;
                auVar17._0_2_ = uVar68;
                auVar17._4_2_ = uVar68;
                auVar17._6_2_ = uVar68;
                auVar17._8_2_ = uVar68;
                auVar17._10_2_ = uVar68;
                auVar17._12_2_ = uVar68;
                auVar17._14_2_ = uVar68;
                auVar17._16_2_ = uVar68;
                auVar17._18_2_ = uVar68;
                auVar17._20_2_ = uVar68;
                auVar17._22_2_ = uVar68;
                auVar17._24_2_ = uVar68;
                auVar17._26_2_ = uVar68;
                auVar17._28_2_ = uVar68;
                auVar17._30_2_ = uVar68;
                auVar12._2_2_ = uVar67;
                auVar12._0_2_ = uVar67;
                auVar12._4_2_ = uVar67;
                auVar12._6_2_ = uVar67;
                auVar12._8_2_ = uVar67;
                auVar12._10_2_ = uVar67;
                auVar12._12_2_ = uVar67;
                auVar12._14_2_ = uVar67;
                auVar12._16_2_ = uVar67;
                auVar12._18_2_ = uVar67;
                auVar12._20_2_ = uVar67;
                auVar12._22_2_ = uVar67;
                auVar12._24_2_ = uVar67;
                auVar12._26_2_ = uVar67;
                auVar12._28_2_ = uVar67;
                auVar12._30_2_ = uVar67;
                uVar35 = iVar65 - 1;
                auVar76 = vpsubsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar12);
                lVar40 = (ulong)uVar35 << 5;
                auVar75._8_2_ = 1;
                auVar75._0_8_ = 0x1000100010001;
                auVar75._10_2_ = 1;
                auVar75._12_2_ = 1;
                auVar75._14_2_ = 1;
                auVar75._16_2_ = 1;
                auVar75._18_2_ = 1;
                auVar75._20_2_ = 1;
                auVar75._22_2_ = 1;
                auVar75._24_2_ = 1;
                auVar75._26_2_ = 1;
                auVar75._28_2_ = 1;
                auVar75._30_2_ = 1;
                uVar41 = uVar66;
                auVar12 = auVar75;
                do {
                  *(undefined1 (*) [32])((long)*ptr_04 + lVar40) = auVar76;
                  *(undefined1 (*) [32])((long)*ptr_05 + lVar40) = auVar12;
                  auVar76 = vpsubsw_avx2(auVar76,auVar17);
                  auVar12 = vpaddsw_avx2(auVar12,auVar75);
                  lVar40 = lVar40 + -0x20;
                  iVar48 = (int)uVar41;
                  uVar47 = iVar48 - 1;
                  uVar41 = (ulong)uVar47;
                } while (uVar47 != 0 && 0 < iVar48);
                uVar41 = (ulong)(iVar65 + (uint)(iVar65 == 0));
                uVar42 = 0;
                iVar48 = iVar50;
                do {
                  lVar40 = 0;
                  iVar53 = iVar48;
                  do {
                    uVar56 = 0x8000;
                    if (-0x8000 < iVar53) {
                      uVar56 = (undefined2)iVar53;
                    }
                    *(undefined2 *)((long)&local_80 + lVar40 * 2) = uVar56;
                    lVar40 = lVar40 + 1;
                    iVar53 = iVar53 - iVar65 * gap;
                  } while (lVar40 != 0x10);
                  palVar1 = ptr + uVar42;
                  (*palVar1)[0] = local_80;
                  (*palVar1)[1] = lStack_78;
                  (*palVar1)[2] = lStack_70;
                  (*palVar1)[3] = lStack_68;
                  uVar42 = uVar42 + 1;
                  iVar48 = iVar48 - gap;
                } while (uVar42 != uVar41);
                *ptr_06 = 0;
                uVar42 = 1;
                if (1 < s2Len) {
                  uVar42 = uVar63;
                }
                uVar49 = 0;
                do {
                  iVar51 = -0x8000;
                  if (-0x8000 < iVar50) {
                    iVar51 = (int16_t)iVar50;
                  }
                  ptr_06[uVar49 + 1] = iVar51;
                  iVar50 = iVar50 - gap;
                  uVar49 = uVar49 + 1;
                } while (uVar42 != uVar49);
                auVar12 = vpalignr_avx2(auVar70,auVar25,0xe);
                uVar42 = 1;
                if (1 < s2Len) {
                  uVar42 = uVar63;
                }
                lVar11 = uVar41 << 5;
                lVar37 = uVar66 * uVar63;
                lVar40 = lVar37 * 4;
                lVar2 = lVar37 * 8;
                lVar31 = lVar37 * 0x1c;
                lVar57 = lVar37 * 0x2c;
                lVar58 = lVar37 * 0x34;
                lVar59 = lVar37 * 0x38;
                lVar60 = lVar37 * 0x3c;
                lVar38 = lVar37 * 0x10;
                lVar43 = lVar37 * 0x20;
                local_220._2_2_ = uVar69;
                local_220._0_2_ = uVar69;
                local_220._4_2_ = uVar69;
                local_220._6_2_ = uVar69;
                local_220._8_2_ = uVar69;
                local_220._10_2_ = uVar69;
                local_220._12_2_ = uVar69;
                local_220._14_2_ = uVar69;
                local_220._16_2_ = uVar69;
                local_220._18_2_ = uVar69;
                local_220._20_2_ = uVar69;
                local_220._22_2_ = uVar69;
                local_220._24_2_ = uVar69;
                local_220._26_2_ = uVar69;
                local_220._28_2_ = uVar69;
                local_220._30_2_ = uVar69;
                auVar72 = ZEXT3264(local_220);
                local_200._2_2_ = sVar32;
                local_200._0_2_ = sVar32;
                local_200._4_2_ = sVar32;
                local_200._6_2_ = sVar32;
                local_200._10_2_ = sVar32;
                local_200._8_2_ = sVar32;
                local_200._12_2_ = sVar32;
                local_200._14_2_ = sVar32;
                local_200._18_2_ = sVar32;
                local_200._16_2_ = sVar32;
                local_200._20_2_ = sVar32;
                local_200._22_2_ = sVar32;
                local_200._26_2_ = sVar32;
                local_200._24_2_ = sVar32;
                local_200._28_2_ = sVar32;
                local_200._30_2_ = sVar32;
                lVar26 = lVar37 * 0xc;
                lVar27 = lVar37 * 0x14;
                lVar28 = lVar37 * 0x18;
                lVar29 = lVar37 * 0x24;
                lVar30 = lVar37 * 0x28;
                lVar37 = lVar37 * 0x30;
                local_348 = 0;
                uVar66 = 0;
                do {
                  lVar44 = (long)(ppVar8->mapper[(byte)s2[uVar66]] * iVar65) * 0x20;
                  auVar23._2_2_ = uVar69;
                  auVar23._0_2_ = uVar69;
                  auVar23._4_2_ = uVar69;
                  auVar23._6_2_ = uVar69;
                  auVar23._8_2_ = uVar69;
                  auVar23._10_2_ = uVar69;
                  auVar23._12_2_ = uVar69;
                  auVar23._14_2_ = uVar69;
                  auVar23._16_2_ = uVar69;
                  auVar23._18_2_ = uVar69;
                  auVar23._20_2_ = uVar69;
                  auVar23._22_2_ = uVar69;
                  auVar23._24_2_ = uVar69;
                  auVar23._26_2_ = uVar69;
                  auVar23._28_2_ = uVar69;
                  auVar23._30_2_ = uVar69;
                  auVar75 = vpsubsw_avx2(auVar23,(undefined1  [32])*ptr_04);
                  auVar73 = SUB3216(ptr[uVar35],0);
                  auVar76._0_16_ = ZEXT116(0) * auVar73 + ZEXT116(1) * auVar72._0_16_;
                  auVar76._16_16_ = ZEXT116(0) * auVar72._16_16_ + ZEXT116(1) * auVar73;
                  auVar76 = vpalignr_avx2((undefined1  [32])ptr[uVar35],auVar76,0xe);
                  auVar73 = vpinsrw_avx(auVar76._0_16_,(uint)(ushort)ptr_06[uVar66],0);
                  auVar76 = vpblendd_avx2(auVar76,ZEXT1632(auVar73),0xf);
                  alVar3 = b_05[uVar35];
                  auVar25 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                  auVar17 = vpalignr_avx2((undefined1  [32])alVar3,auVar25,0xe);
                  alVar3 = b_04[uVar35];
                  auVar25 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                  auVar25 = vpalignr_avx2((undefined1  [32])alVar3,auVar25,0xe);
                  alVar3 = b_03[uVar35];
                  auVar70 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                  auVar70 = vpalignr_avx2((undefined1  [32])alVar3,auVar70,0xe);
                  local_3a0 = ZEXT1632(ZEXT816(0));
                  lVar55 = 0;
                  auVar72 = ZEXT1664((undefined1  [16])0x0);
                  auVar81 = ZEXT1664((undefined1  [16])0x0);
                  do {
                    auVar77 = vpaddsw_avx2(auVar76,*(undefined1 (*) [32])
                                                    ((long)pvVar7 + lVar55 + lVar44));
                    auVar13 = vpaddsw_avx2(auVar70,*(undefined1 (*) [32])
                                                    ((long)pvVar9 + lVar55 + lVar44));
                    auVar76 = *(undefined1 (*) [32])((long)*ptr + lVar55);
                    auVar70 = *(undefined1 (*) [32])((long)*b_03 + lVar55);
                    auVar14 = vpaddsw_avx2(auVar25,*(undefined1 (*) [32])
                                                    ((long)pvVar10 + lVar55 + lVar44));
                    auVar25 = *(undefined1 (*) [32])((long)*b_04 + lVar55);
                    auVar75 = vpaddsw_avx2(auVar75,*(undefined1 (*) [32])((long)*ptr_04 + lVar55));
                    auVar21._8_2_ = 1;
                    auVar21._0_8_ = 0x1000100010001;
                    auVar21._10_2_ = 1;
                    auVar21._12_2_ = 1;
                    auVar21._14_2_ = 1;
                    auVar21._16_2_ = 1;
                    auVar21._18_2_ = 1;
                    auVar21._20_2_ = 1;
                    auVar21._22_2_ = 1;
                    auVar21._24_2_ = 1;
                    auVar21._26_2_ = 1;
                    auVar21._28_2_ = 1;
                    auVar21._30_2_ = 1;
                    auVar15 = vpaddsw_avx2(auVar17,auVar21);
                    auVar17 = *(undefined1 (*) [32])((long)*b_05 + lVar55);
                    auVar20 = vpcmpgtw_avx2(auVar75,auVar23);
                    auVar18 = vpblendvb_avx2(auVar81._0_32_,local_1e0,auVar20);
                    auVar19 = vpblendvb_avx2(auVar72._0_32_,local_1a0,auVar20);
                    auVar16 = vpaddsw_avx2(local_180,*(undefined1 (*) [32])((long)*ptr_05 + lVar55))
                    ;
                    local_3a0 = vpblendvb_avx2(local_3a0,auVar16,auVar20);
                    auVar16._2_2_ = uVar67;
                    auVar16._0_2_ = uVar67;
                    auVar16._4_2_ = uVar67;
                    auVar16._6_2_ = uVar67;
                    auVar16._8_2_ = uVar67;
                    auVar16._10_2_ = uVar67;
                    auVar16._12_2_ = uVar67;
                    auVar16._14_2_ = uVar67;
                    auVar16._16_2_ = uVar67;
                    auVar16._18_2_ = uVar67;
                    auVar16._20_2_ = uVar67;
                    auVar16._22_2_ = uVar67;
                    auVar16._24_2_ = uVar67;
                    auVar16._26_2_ = uVar67;
                    auVar16._28_2_ = uVar67;
                    auVar16._30_2_ = uVar67;
                    auVar20 = vpsubsw_avx2(auVar76,auVar16);
                    auVar24._2_2_ = uVar68;
                    auVar24._0_2_ = uVar68;
                    auVar24._4_2_ = uVar68;
                    auVar24._6_2_ = uVar68;
                    auVar24._8_2_ = uVar68;
                    auVar24._10_2_ = uVar68;
                    auVar24._12_2_ = uVar68;
                    auVar24._14_2_ = uVar68;
                    auVar24._16_2_ = uVar68;
                    auVar24._18_2_ = uVar68;
                    auVar24._20_2_ = uVar68;
                    auVar24._22_2_ = uVar68;
                    auVar24._24_2_ = uVar68;
                    auVar24._26_2_ = uVar68;
                    auVar24._28_2_ = uVar68;
                    auVar24._30_2_ = uVar68;
                    auVar24 = vpsubsw_avx2(*(undefined1 (*) [32])((long)*b + lVar55),auVar24);
                    auVar16 = vpcmpgtw_avx2(auVar20,auVar24);
                    auVar22 = vpmaxsw_avx2(auVar20,auVar24);
                    auVar20 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_00 + lVar55),auVar70,
                                             auVar16);
                    auVar24 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_01 + lVar55),auVar25,
                                             auVar16);
                    auVar16 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_02 + lVar55),auVar17,
                                             auVar16);
                    auVar16 = vpaddsw_avx2(auVar21,auVar16);
                    auVar21 = vpcmpgtw_avx2(auVar22,auVar77);
                    *(undefined1 (*) [32])((long)*b + lVar55) = auVar22;
                    *(undefined1 (*) [32])((long)*b_00 + lVar55) = auVar20;
                    local_1e0 = vpblendvb_avx2(auVar13,auVar20,auVar21);
                    *(undefined1 (*) [32])((long)*b_01 + lVar55) = auVar24;
                    local_1a0 = vpblendvb_avx2(auVar14,auVar24,auVar21);
                    local_180 = vpblendvb_avx2(auVar15,auVar16,auVar21);
                    *(undefined1 (*) [32])((long)*b_02 + lVar55) = auVar16;
                    auVar81 = ZEXT3264(auVar18);
                    auVar23 = vpmaxsw_avx2(auVar23,auVar75);
                    auVar75 = vpmaxsw_avx2(auVar22,auVar77);
                    auVar72 = ZEXT3264(auVar19);
                    *(undefined1 (*) [32])((long)*ptr + lVar55) = auVar77;
                    *(undefined1 (*) [32])((long)*b_03 + lVar55) = auVar13;
                    *(undefined1 (*) [32])((long)*b_04 + lVar55) = auVar14;
                    *(undefined1 (*) [32])((long)*b_05 + lVar55) = auVar15;
                    lVar55 = lVar55 + 0x20;
                  } while (lVar11 != lVar55);
                  auVar13._2_2_ = uVar67;
                  auVar13._0_2_ = uVar67;
                  auVar13._4_2_ = uVar67;
                  auVar13._6_2_ = uVar67;
                  auVar13._8_2_ = uVar67;
                  auVar13._10_2_ = uVar67;
                  auVar13._12_2_ = uVar67;
                  auVar13._14_2_ = uVar67;
                  auVar13._16_2_ = uVar67;
                  auVar13._18_2_ = uVar67;
                  auVar13._20_2_ = uVar67;
                  auVar13._22_2_ = uVar67;
                  auVar13._24_2_ = uVar67;
                  auVar13._26_2_ = uVar67;
                  auVar13._28_2_ = uVar67;
                  auVar13._30_2_ = uVar67;
                  auVar76 = vperm2i128_avx2(local_1e0,local_1e0,0x28);
                  local_1e0 = vpalignr_avx2(local_1e0,auVar76,0xe);
                  auVar76 = vperm2i128_avx2(local_1a0,local_1a0,0x28);
                  local_1a0 = vpalignr_avx2(local_1a0,auVar76,0xe);
                  auVar25 = vperm2i128_avx2(local_180,local_180,0x28);
                  auVar77._0_16_ = ZEXT116(0) * auVar75._0_16_ + ZEXT116(1) * local_1a0._0_16_;
                  auVar77._16_16_ = ZEXT116(0) * local_1a0._16_16_ + ZEXT116(1) * auVar75._0_16_;
                  auVar76 = vpalignr_avx2(auVar75,auVar77,0xe);
                  auVar73 = vpinsrw_avx(auVar76._0_16_,(uint)(ushort)ptr_06[uVar66 + 1],0);
                  local_180 = vpalignr_avx2(local_180,auVar25,0xe);
                  auVar77 = vpblendd_avx2(auVar76,ZEXT1632(auVar73),0xf);
                  auVar76 = vpaddsw_avx2(auVar77,(undefined1  [32])*ptr_04);
                  auVar70 = vpcmpgtw_avx2(auVar23,auVar76);
                  auVar75 = vpmaxsw_avx2(auVar23,auVar76);
                  auVar17 = vpblendvb_avx2(local_1e0,auVar18,auVar70);
                  auVar25 = vpblendvb_avx2(local_1a0,auVar19,auVar70);
                  auVar76 = vpaddsw_avx2(local_180,(undefined1  [32])*ptr_05);
                  uVar66 = uVar66 + 1;
                  auVar76 = vpblendvb_avx2(auVar76,local_3a0,auVar70);
                  iVar48 = 0xe;
                  do {
                    auVar14 = vperm2i128_avx2(auVar76,auVar76,0x28);
                    auVar15 = vperm2i128_avx2(auVar25,auVar25,0x28);
                    auVar16 = vperm2i128_avx2(auVar17,auVar17,0x28);
                    auVar70 = vperm2i128_avx2(auVar75,auVar75,0x28);
                    auVar70 = vpalignr_avx2(auVar75,auVar70,0xe);
                    auVar70 = vpaddsw_avx2(auVar71,auVar70);
                    auVar23 = vpcmpgtw_avx2(auVar75,auVar70);
                    auVar75 = vpmaxsw_avx2(auVar75,auVar70);
                    auVar70 = vpalignr_avx2(auVar17,auVar16,0xe);
                    auVar17 = vpblendvb_avx2(auVar70,auVar17,auVar23);
                    auVar70 = vpalignr_avx2(auVar25,auVar15,0xe);
                    auVar25 = vpblendvb_avx2(auVar70,auVar25,auVar23);
                    auVar70 = vpalignr_avx2(auVar76,auVar14,0xe);
                    auVar70 = vpaddsw_avx2(auVar70,auVar12);
                    auVar76 = vpblendvb_avx2(auVar70,auVar76,auVar23);
                    iVar48 = iVar48 + -1;
                  } while (iVar48 != 0);
                  auVar70 = vperm2i128_avx2(auVar76,auVar76,0x28);
                  auVar70 = vpalignr_avx2(auVar76,auVar70,0xe);
                  auVar76 = vperm2i128_avx2(auVar25,auVar25,0x28);
                  auVar25 = vpalignr_avx2(auVar25,auVar76,0xe);
                  auVar76 = vperm2i128_avx2(auVar17,auVar17,0x28);
                  auVar17 = vpalignr_avx2(auVar17,auVar76,0xe);
                  auVar76 = vperm2i128_avx2(auVar75,auVar75,0x28);
                  auVar76 = vpalignr_avx2(auVar75,auVar76,0xe);
                  auVar76 = vpaddsw_avx2(auVar76,auVar74);
                  auVar75 = vpcmpgtw_avx2(auVar76,auVar77);
                  auVar14 = vpblendvb_avx2(local_180,auVar70,auVar75);
                  auVar23 = vpblendvb_avx2(local_1a0,auVar25,auVar75);
                  auVar75 = vpblendvb_avx2(local_1e0,auVar17,auVar75);
                  auVar77 = vpmaxsw_avx2(auVar76,auVar77);
                  lVar55 = 0;
                  auVar72 = ZEXT3264(local_220);
                  lVar44 = local_348;
                  do {
                    auVar15._8_2_ = 1;
                    auVar15._0_8_ = 0x1000100010001;
                    auVar15._10_2_ = 1;
                    auVar15._12_2_ = 1;
                    auVar15._14_2_ = 1;
                    auVar15._16_2_ = 1;
                    auVar15._18_2_ = 1;
                    auVar15._20_2_ = 1;
                    auVar15._22_2_ = 1;
                    auVar15._24_2_ = 1;
                    auVar15._26_2_ = 1;
                    auVar15._28_2_ = 1;
                    auVar15._30_2_ = 1;
                    auVar16 = *(undefined1 (*) [32])((long)*ptr + lVar55);
                    auVar77 = vpsubsw_avx2(auVar77,auVar13);
                    auVar18._2_2_ = uVar68;
                    auVar18._0_2_ = uVar68;
                    auVar18._4_2_ = uVar68;
                    auVar18._6_2_ = uVar68;
                    auVar18._8_2_ = uVar68;
                    auVar18._10_2_ = uVar68;
                    auVar18._12_2_ = uVar68;
                    auVar18._14_2_ = uVar68;
                    auVar18._16_2_ = uVar68;
                    auVar18._18_2_ = uVar68;
                    auVar18._20_2_ = uVar68;
                    auVar18._22_2_ = uVar68;
                    auVar18._24_2_ = uVar68;
                    auVar18._26_2_ = uVar68;
                    auVar18._28_2_ = uVar68;
                    auVar18._30_2_ = uVar68;
                    auVar18 = vpsubsw_avx2(auVar76,auVar18);
                    auVar76 = vpmaxsw_avx2(auVar77,auVar18);
                    auVar77 = vpcmpgtw_avx2(auVar77,auVar18);
                    auVar17 = vpblendvb_avx2(auVar17,auVar75,auVar77);
                    auVar70 = vpblendvb_avx2(auVar70,auVar14,auVar77);
                    auVar18 = vpmaxsw_avx2(auVar16,*(undefined1 (*) [32])((long)*b + lVar55));
                    auVar25 = vpblendvb_avx2(auVar25,auVar23,auVar77);
                    auVar14 = vpcmpgtw_avx2(auVar18,auVar76);
                    auVar75 = vpblendvb_avx2(auVar17,*(undefined1 (*) [32])((long)*b_00 + lVar55),
                                             auVar14);
                    auVar70 = vpaddsw_avx2(auVar15,auVar70);
                    auVar23 = vpblendvb_avx2(auVar25,*(undefined1 (*) [32])((long)*b_01 + lVar55),
                                             auVar14);
                    auVar77 = vpmaxsw_avx2(auVar76,auVar18);
                    auVar14 = vpblendvb_avx2(auVar70,*(undefined1 (*) [32])((long)*b_02 + lVar55),
                                             auVar14);
                    auVar15 = vpcmpeqw_avx2(auVar77,auVar16);
                    auVar75 = vpblendvb_avx2(auVar75,*(undefined1 (*) [32])((long)*b_03 + lVar55),
                                             auVar15);
                    auVar23 = vpblendvb_avx2(auVar23,*(undefined1 (*) [32])((long)*b_04 + lVar55),
                                             auVar15);
                    auVar14 = vpblendvb_avx2(auVar14,*(undefined1 (*) [32])((long)*b_05 + lVar55),
                                             auVar15);
                    *(undefined1 (*) [32])((long)*ptr + lVar55) = auVar77;
                    *(undefined1 (*) [32])((long)*b_03 + lVar55) = auVar75;
                    *(undefined1 (*) [32])((long)*b_04 + lVar55) = auVar23;
                    *(undefined1 (*) [32])((long)*b_05 + lVar55) = auVar14;
                    lVar54 = *((ppVar36->field_4).trace)->trace_del_table;
                    auVar73 = auVar77._0_16_;
                    uVar61 = vpextrw_avx(auVar73,1);
                    *(int *)(lVar54 + lVar44) = (int)auVar77._0_2_;
                    uVar62 = vpextrw_avx(auVar73,2);
                    lVar54 = lVar54 + lVar44;
                    *(int *)(lVar40 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,3);
                    *(int *)(lVar2 + lVar54) = (int)(short)uVar62;
                    uVar62 = vpextrw_avx(auVar73,4);
                    *(int *)(lVar26 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,5);
                    *(int *)(lVar38 + lVar54) = (int)(short)uVar62;
                    uVar62 = vpextrw_avx(auVar73,6);
                    *(int *)(lVar27 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,7);
                    *(int *)(lVar28 + lVar54) = (int)(short)uVar62;
                    auVar73 = auVar77._16_16_;
                    *(int *)(lVar31 + lVar54) = (int)(short)uVar61;
                    uVar62 = vpextrw_avx(auVar73,1);
                    *(int *)(lVar43 + lVar54) = (int)auVar77._16_2_;
                    uVar61 = vpextrw_avx(auVar73,2);
                    *(int *)(lVar29 + lVar54) = (int)(short)uVar62;
                    uVar62 = vpextrw_avx(auVar73,3);
                    *(int *)(lVar30 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,4);
                    *(int *)(lVar57 + lVar54) = (int)(short)uVar62;
                    uVar62 = vpextrw_avx(auVar73,5);
                    *(int *)(lVar37 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,6);
                    *(int *)(lVar58 + lVar54) = (int)(short)uVar62;
                    uVar62 = vpextrw_avx(auVar73,7);
                    *(int *)(lVar59 + lVar54) = (int)(short)uVar61;
                    *(int *)(lVar60 + lVar54) = (int)(short)uVar62;
                    lVar54 = *(long *)((long)((ppVar36->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar54 + lVar44) = (int)auVar75._0_2_;
                    auVar73 = auVar75._0_16_;
                    uVar61 = vpextrw_avx(auVar73,1);
                    lVar54 = lVar54 + lVar44;
                    *(int *)(lVar40 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,2);
                    *(int *)(lVar2 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,3);
                    *(int *)(lVar26 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,4);
                    *(int *)(lVar38 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,5);
                    *(int *)(lVar27 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,6);
                    *(int *)(lVar28 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,7);
                    *(int *)(lVar31 + lVar54) = (int)(short)uVar61;
                    auVar73 = auVar75._16_16_;
                    *(int *)(lVar43 + lVar54) = (int)auVar75._16_2_;
                    uVar61 = vpextrw_avx(auVar73,1);
                    *(int *)(lVar29 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,2);
                    *(int *)(lVar30 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,3);
                    *(int *)(lVar57 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,4);
                    *(int *)(lVar37 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,5);
                    *(int *)(lVar58 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,6);
                    *(int *)(lVar59 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,7);
                    *(int *)(lVar60 + lVar54) = (int)(short)uVar61;
                    lVar54 = *(long *)((long)((ppVar36->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar54 + lVar44) = (int)auVar23._0_2_;
                    auVar73 = auVar23._0_16_;
                    uVar61 = vpextrw_avx(auVar73,1);
                    lVar54 = lVar54 + lVar44;
                    *(int *)(lVar40 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,2);
                    *(int *)(lVar2 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,3);
                    *(int *)(lVar26 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,4);
                    *(int *)(lVar38 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,5);
                    *(int *)(lVar27 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,6);
                    *(int *)(lVar28 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,7);
                    *(int *)(lVar31 + lVar54) = (int)(short)uVar61;
                    auVar73 = auVar23._16_16_;
                    *(int *)(lVar43 + lVar54) = (int)auVar23._16_2_;
                    uVar61 = vpextrw_avx(auVar73,1);
                    *(int *)(lVar29 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,2);
                    *(int *)(lVar30 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,3);
                    *(int *)(lVar57 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,4);
                    *(int *)(lVar37 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,5);
                    *(int *)(lVar58 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,6);
                    *(int *)(lVar59 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,7);
                    *(int *)(lVar60 + lVar54) = (int)(short)uVar61;
                    lVar54 = *(long *)((long)((ppVar36->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar54 + lVar44) = (int)auVar14._0_2_;
                    lVar54 = lVar54 + lVar44;
                    auVar73 = auVar14._0_16_;
                    uVar61 = vpextrw_avx(auVar73,1);
                    *(int *)(lVar40 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,2);
                    *(int *)(lVar2 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,3);
                    *(int *)(lVar26 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,4);
                    *(int *)(lVar38 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,5);
                    *(int *)(lVar27 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,6);
                    *(int *)(lVar28 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,7);
                    *(int *)(lVar31 + lVar54) = (int)(short)uVar61;
                    auVar73 = auVar14._16_16_;
                    *(int *)(lVar43 + lVar54) = (int)auVar14._16_2_;
                    uVar61 = vpextrw_avx(auVar73,1);
                    *(int *)(lVar29 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,2);
                    *(int *)(lVar30 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,3);
                    *(int *)(lVar57 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,4);
                    *(int *)(lVar37 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,5);
                    *(int *)(lVar58 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,6);
                    *(int *)(lVar59 + lVar54) = (int)(short)uVar61;
                    uVar61 = vpextrw_avx(auVar73,7);
                    *(int *)(lVar60 + lVar54) = (int)(short)uVar61;
                    local_200 = vpminsw_avx2(auVar77,local_200);
                    auVar15 = vpmaxsw_avx2(auVar77,auVar72._0_32_);
                    auVar15 = vpmaxsw_avx2(auVar75,auVar15);
                    auVar16 = vpmaxsw_avx2(auVar23,auVar14);
                    local_220 = vpmaxsw_avx2(auVar15,auVar16);
                    auVar72 = ZEXT3264(local_220);
                    lVar55 = lVar55 + 0x20;
                    lVar44 = lVar44 + uVar63 * 4;
                  } while (lVar11 != lVar55);
                  local_348 = local_348 + 4;
                } while (uVar66 != uVar42);
                alVar3 = ptr[uVar46];
                auVar73 = alVar3._16_16_;
                alVar4 = b_03[uVar46];
                auVar80 = alVar4._16_16_;
                alVar5 = b_04[uVar46];
                auVar79 = alVar5._16_16_;
                alVar6 = b_05[uVar46];
                auVar78 = alVar6._16_16_;
                if (iVar64 / iVar65 < 0xf) {
                  iVar48 = 1;
                  if (1 < iVar34) {
                    iVar48 = iVar34;
                  }
                  do {
                    auVar71 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28
                                             );
                    alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar71,0xe);
                    auVar73 = alVar3._16_16_;
                    auVar71 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,0x28
                                             );
                    alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar71,0xe);
                    auVar80 = alVar4._16_16_;
                    auVar71 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,0x28
                                             );
                    alVar5 = (__m256i)vpalignr_avx2((undefined1  [32])alVar5,auVar71,0xe);
                    auVar79 = alVar5._16_16_;
                    auVar71 = vperm2i128_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar6,0x28
                                             );
                    alVar6 = (__m256i)vpalignr_avx2((undefined1  [32])alVar6,auVar71,0xe);
                    auVar78 = alVar6._16_16_;
                    iVar48 = iVar48 + -1;
                  } while (iVar48 != 0);
                }
                auVar25._2_2_ = uVar69;
                auVar25._0_2_ = uVar69;
                auVar25._4_2_ = uVar69;
                auVar25._6_2_ = uVar69;
                auVar25._8_2_ = uVar69;
                auVar25._10_2_ = uVar69;
                auVar25._12_2_ = uVar69;
                auVar25._14_2_ = uVar69;
                auVar25._16_2_ = uVar69;
                auVar25._18_2_ = uVar69;
                auVar25._20_2_ = uVar69;
                auVar25._22_2_ = uVar69;
                auVar25._24_2_ = uVar69;
                auVar25._26_2_ = uVar69;
                auVar25._28_2_ = uVar69;
                auVar25._30_2_ = uVar69;
                auVar71 = vpcmpgtw_avx2(auVar25,local_200);
                auVar74._2_2_ = sVar32;
                auVar74._0_2_ = sVar32;
                auVar74._4_2_ = sVar32;
                auVar74._6_2_ = sVar32;
                auVar74._8_2_ = sVar32;
                auVar74._10_2_ = sVar32;
                auVar74._12_2_ = sVar32;
                auVar74._14_2_ = sVar32;
                auVar74._16_2_ = sVar32;
                auVar74._18_2_ = sVar32;
                auVar74._20_2_ = sVar32;
                auVar74._22_2_ = sVar32;
                auVar74._24_2_ = sVar32;
                auVar74._26_2_ = sVar32;
                auVar74._28_2_ = sVar32;
                auVar74._30_2_ = sVar32;
                auVar12 = vpcmpgtw_avx2(local_220,auVar74);
                auVar71 = vpor_avx2(auVar12,auVar71);
                if ((((((((((((((((((((((((((((((((auVar71 >> 7 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0 &&
                                                 (auVar71 >> 0xf & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar71 >> 0x17 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar71 >> 0x1f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar71 >> 0x27 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar71 >> 0x2f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar71 >> 0x37 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar71 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar71 >> 0x47 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar71 >> 0x4f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar71 >> 0x57 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar71 >> 0x5f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar71 >> 0x67 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar71 >> 0x6f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar71 >> 0x77 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar71 >> 0x7f,0) == '\0') &&
                                  (auVar71 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar71 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar71 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar71 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar71 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar71 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar71 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar71 >> 0xbf,0) == '\0') &&
                          (auVar71 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar71 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar71 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar71 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar71 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar71 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar71 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    -1 < auVar71[0x1f]) {
                  uVar61 = vpextrw_avx(auVar73,7);
                  sVar32 = (short)uVar61;
                  uVar61 = vpextrw_avx(auVar80,7);
                  sVar39 = (short)uVar61;
                  uVar61 = vpextrw_avx(auVar79,7);
                  sVar45 = (short)uVar61;
                  uVar61 = vpextrw_avx(auVar78,7);
                  sVar52 = (short)uVar61;
                }
                else {
                  *(byte *)&ppVar36->flag = (byte)ppVar36->flag | 0x40;
                  sVar32 = 0;
                  sVar39 = 0;
                  sVar45 = 0;
                  sVar52 = 0;
                  iVar33 = 0;
                  iVar64 = 0;
                }
                ppVar36->score = (int)sVar32;
                ppVar36->end_query = iVar64;
                ppVar36->end_ref = iVar33;
                *(int *)(ppVar36->field_4).extra = (int)sVar39;
                ((ppVar36->field_4).stats)->similar = (int)sVar45;
                ((ppVar36->field_4).stats)->length = (int)sVar52;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar36;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile16.score;
    pvPm = (__m256i*)profile->profile16.matches;
    pvPs = (__m256i*)profile->profile16.similar;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi16(segLen), 2);
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int16_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
            vGapperL = _mm256_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        vHpM = _mm256_slli_si256_rpl(vHpM, 2);
        vHpS = _mm256_slli_si256_rpl(vHpS, 2);
        vHpL = _mm256_slli_si256_rpl(vHpL, 2);
        vHp = _mm256_insert_epi16_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_subs_epi16(vH, vGapO);
            vE_ext = _mm256_subs_epi16(vE, vGapE);
            case1 = _mm256_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm256_max_epi16(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_adds_epi16(vEL, vOne);
            vGapper = _mm256_adds_epi16(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vF, vGapper),
                    _mm256_cmpeq_epi16(vF, vGapper));
            vF = _mm256_max_epi16(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_adds_epi16(vHp, vW);
            vHpM = _mm256_adds_epi16(vHpM, vWM);
            vHpS = _mm256_adds_epi16(vHpS, vWS);
            vHpL = _mm256_adds_epi16(vHpL, vOne);
            case1 = _mm256_cmpgt_epi16(vE, vHp);
            vHt = _mm256_max_epi16(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vHtM = _mm256_slli_si256_rpl(vHtM, 2);
        vHtS = _mm256_slli_si256_rpl(vHtS, 2);
        vHtL = _mm256_slli_si256_rpl(vHtL, 2);
        vHt = _mm256_insert_epi16_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_adds_epi16(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi16(vGapper, vF),
                _mm256_cmpeq_epi16(vGapper, vF));
        vF = _mm256_max_epi16(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 2);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 2);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vFt, vF),
                    _mm256_cmpeq_epi16(vFt, vF));
            vF = _mm256_max_epi16(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vFM = _mm256_slli_si256_rpl(vFM, 2);
        vFS = _mm256_slli_si256_rpl(vFS, 2);
        vFL = _mm256_slli_si256_rpl(vFL, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi16(vF, vHt);
        vH = _mm256_max_epi16(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_subs_epi16(vH, vGapO);
            vF_ext = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_adds_epi16(vFL, vOne);
            vH = _mm256_max_epi16(vHp, vE);
            vH = _mm256_max_epi16(vH, vF);
            case1 = _mm256_cmpeq_epi16(vH, vHp);
            case2 = _mm256_cmpeq_epi16(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
                vHM = _mm256_slli_si256_rpl(vHM, 2);
                vHS = _mm256_slli_si256_rpl(vHS, 2);
                vHL = _mm256_slli_si256_rpl(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
            result->stats->rowcols->length_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 2);
            vHM = _mm256_slli_si256_rpl(vHM, 2);
            vHS = _mm256_slli_si256_rpl(vHS, 2);
            vHL = _mm256_slli_si256_rpl(vHL, 2);
        }
        score = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
        matches = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
        similar = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
        length = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}